

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::AudioTrack::Write(AudioTrack *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64 uVar2;
  uint64 uVar3;
  IMkvWriter *writer_00;
  long lVar4;
  long *in_RSI;
  uint64 in_RDI;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t size;
  IMkvWriter *in_stack_ffffffffffffffd0;
  IMkvWriter *in_stack_ffffffffffffffd8;
  long local_20;
  bool local_1;
  
  bVar1 = Track::Write((Track *)size,(IMkvWriter *)payload_position);
  if (bVar1) {
    uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffd0,(float)(in_RDI >> 0x20));
    uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffd0,in_RDI);
    local_20 = uVar3 + uVar2;
    if (*(long *)(in_RDI + 0x78) != 0) {
      uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffd0,in_RDI);
      local_20 = uVar2 + local_20;
    }
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffd8,(uint64)in_stack_ffffffffffffffd0,in_RDI);
    if (bVar1) {
      writer_00 = (IMkvWriter *)(**(code **)(*in_RSI + 8))();
      if ((long)writer_00 < 0) {
        local_1 = false;
      }
      else {
        bVar1 = WriteEbmlElement(writer_00,(uint64)in_stack_ffffffffffffffd0,(float)(in_RDI >> 0x20)
                                );
        if (bVar1) {
          bVar1 = WriteEbmlElement(in_stack_ffffffffffffffd0,in_RDI,0x175b05);
          if (bVar1) {
            if ((*(long *)(in_RDI + 0x78) == 0) ||
               (bVar1 = WriteEbmlElement(in_stack_ffffffffffffffd0,in_RDI,0x175b32), bVar1)) {
              lVar4 = (**(code **)(*in_RSI + 8))();
              if ((lVar4 < 0) || (lVar4 - (long)writer_00 != local_20)) {
                local_1 = false;
              }
              else {
                local_1 = true;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AudioTrack::Write(IMkvWriter* writer) const {
  if (!Track::Write(writer))
    return false;

  // Calculate AudioSettings size.
  uint64_t size = EbmlElementSize(libwebm::kMkvSamplingFrequency,
                                  static_cast<float>(sample_rate_));
  size +=
      EbmlElementSize(libwebm::kMkvChannels, static_cast<uint64>(channels_));
  if (bit_depth_ > 0)
    size +=
        EbmlElementSize(libwebm::kMkvBitDepth, static_cast<uint64>(bit_depth_));

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvAudio, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvSamplingFrequency,
                        static_cast<float>(sample_rate_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvChannels,
                        static_cast<uint64>(channels_)))
    return false;
  if (bit_depth_ > 0)
    if (!WriteEbmlElement(writer, libwebm::kMkvBitDepth,
                          static_cast<uint64>(bit_depth_)))
      return false;

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}